

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

uint luai_makeseed(void)

{
  uint uVar1;
  long lVar3;
  uint buff [4];
  int local_18 [2];
  time_t local_10;
  int *piVar2;
  
  piVar2 = local_18;
  local_10 = time((time_t *)0x0);
  lVar3 = 1;
  do {
    uVar1 = (uint)piVar2 * 0x80 + ((uint)((ulong)piVar2 >> 3) & 0x1fffffff) + local_18[lVar3] ^
            (uint)piVar2;
    piVar2 = (int *)(ulong)uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return uVar1;
}

Assistant:

static unsigned int luai_makeseed (void) {
  unsigned int buff[BUFSEED];
  unsigned int res;
  unsigned int i;
  time_t t = time(NULL);
  char *b = (char*)buff;
  addbuff(b, b);  /* local variable's address */
  addbuff(b, t);  /* time */
  /* fill (rare but possible) remain of the buffer with zeros */
  memset(b, 0, sizeof(buff) - BUFSEEDB);
  res = buff[0];
  for (i = 1; i < BUFSEED; i++)
    res ^= (res >> 3) + (res << 7) + buff[i];
  return res;
}